

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

int run_test_timer_huge_repeat(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x101,"0 == uv_timer_init(uv_default_loop(), &tiny_timer)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&huge_timer1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x102,"0 == uv_timer_init(uv_default_loop(), &huge_timer1)");
    abort();
  }
  iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x103,"0 == uv_timer_start(&tiny_timer, huge_repeat_cb, 2, 2)");
    abort();
  }
  iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x104,"0 == uv_timer_start(&huge_timer1, huge_repeat_cb, 1, (uint64_t) -1)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x105,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x106,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(timer_huge_repeat) {
  ASSERT(0 == uv_timer_init(uv_default_loop(), &tiny_timer));
  ASSERT(0 == uv_timer_init(uv_default_loop(), &huge_timer1));
  ASSERT(0 == uv_timer_start(&tiny_timer, huge_repeat_cb, 2, 2));
  ASSERT(0 == uv_timer_start(&huge_timer1, huge_repeat_cb, 1, (uint64_t) -1));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY();
  return 0;
}